

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

bool wabt::anon_unknown_0::func_uses_simd(FuncSignature *sig)

{
  pointer pTVar1;
  long lVar2;
  pointer pTVar3;
  pointer pTVar4;
  long lVar5;
  
  pTVar3 = (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = (long)pTVar1 - (long)pTVar3;
  for (lVar5 = lVar2 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (pTVar3->enum_ == V128) goto LAB_0019827e;
    if (pTVar3[1].enum_ == V128) {
      pTVar3 = pTVar3 + 1;
      goto LAB_0019827e;
    }
    if (pTVar3[2].enum_ == V128) {
      pTVar3 = pTVar3 + 2;
      goto LAB_0019827e;
    }
    if (pTVar3[3].enum_ == V128) {
      pTVar3 = pTVar3 + 3;
      goto LAB_0019827e;
    }
    pTVar3 = pTVar3 + 4;
    lVar2 = lVar2 + -0x20;
  }
  lVar2 = lVar2 >> 3;
  if (lVar2 == 1) {
LAB_00198266:
    if (pTVar3->enum_ != V128) {
      pTVar3 = pTVar1;
    }
LAB_0019827e:
    if (pTVar3 != pTVar1) {
      return true;
    }
  }
  else {
    if (lVar2 == 2) {
LAB_0019825e:
      if (pTVar3->enum_ != V128) {
        pTVar3 = pTVar3 + 1;
        goto LAB_00198266;
      }
      goto LAB_0019827e;
    }
    if (lVar2 == 3) {
      if (pTVar3->enum_ != V128) {
        pTVar3 = pTVar3 + 1;
        goto LAB_0019825e;
      }
      goto LAB_0019827e;
    }
  }
  pTVar3 = (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = (long)pTVar1 - (long)pTVar3;
  for (lVar5 = lVar2 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
    pTVar4 = pTVar3;
    if (pTVar3->enum_ == V128) goto LAB_00198304;
    if (pTVar3[1].enum_ == V128) {
      pTVar4 = pTVar3 + 1;
      goto LAB_00198304;
    }
    if (pTVar3[2].enum_ == V128) {
      pTVar4 = pTVar3 + 2;
      goto LAB_00198304;
    }
    if (pTVar3[3].enum_ == V128) {
      pTVar4 = pTVar3 + 3;
      goto LAB_00198304;
    }
    pTVar3 = pTVar3 + 4;
    lVar2 = lVar2 + -0x20;
  }
  lVar2 = lVar2 >> 3;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      pTVar4 = pTVar1;
      if ((lVar2 != 3) || (pTVar4 = pTVar3, pTVar3->enum_ == V128)) goto LAB_00198304;
      pTVar3 = pTVar3 + 1;
    }
    pTVar4 = pTVar3;
    if (pTVar3->enum_ == V128) goto LAB_00198304;
    pTVar3 = pTVar3 + 1;
  }
  pTVar4 = pTVar3;
  if (pTVar3->enum_ != V128) {
    pTVar4 = pTVar1;
  }
LAB_00198304:
  return pTVar4 != pTVar1;
}

Assistant:

static bool func_uses_simd(const FuncSignature& sig) {
  return std::any_of(sig.param_types.begin(), sig.param_types.end(),
                     [](auto x) { return x == Type::V128; }) ||
         std::any_of(sig.result_types.begin(), sig.result_types.end(),
                     [](auto x) { return x == Type::V128; });
}